

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

void __thiscall duckdb::GroupedAggregateHashTable::Abandon(GroupedAggregateHashTable *this)

{
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this_00;
  ClientContext *context;
  pointer pPVar1;
  type new_partitioned_data;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  if (2 < this->radix_bits) {
    if ((this->unpartitioned_data).
        super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
        .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl !=
        (PartitionedTupleData *)0x0) {
      this_00 = &this->unpartitioned_data;
      pPVar1 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator->(this_00);
      PartitionedTupleData::FlushAppendState(pPVar1,&(this->state).unpartitioned_append_state);
      pPVar1 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator->(this_00);
      PartitionedTupleData::Unpin(pPVar1);
      pPVar1 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator->(this_00);
      context = this->context;
      new_partitioned_data =
           unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator*(&this->partitioned_data);
      PartitionedTupleData::Repartition(pPVar1,context,new_partitioned_data);
    }
    InitializeUnpartitionedData(this);
  }
  ClearPointerTable(this);
  this->count = 0;
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  ::std::__cxx11::string::operator=((string *)&(this->state).dict_state,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void GroupedAggregateHashTable::Abandon() {
	if (radix_bits >= UNPARTITIONED_RADIX_BITS_THRESHOLD) {
		// Flush/unpin unpartitioned data and append to partitioned data
		if (unpartitioned_data) {
			unpartitioned_data->FlushAppendState(state.unpartitioned_append_state);
			unpartitioned_data->Unpin();
			unpartitioned_data->Repartition(context, *partitioned_data);
		}
		InitializeUnpartitionedData();
	}

	// Start over
	ClearPointerTable();
	count = 0;

	// Resetting the id ensures the dict state is reset properly when needed
	state.dict_state.dictionary_id = string();
}